

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t SaveEXRMultipartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  char *pcVar1;
  size_t sVar2;
  char *local_30 [2];
  char local_20 [16];
  
  if ((num_parts < 2 || (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) ||
      memory_out == (uchar **)0x0) {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,"Invalid argument for SaveEXRNPartImageToMemory","");
    if (err != (char **)0x0) {
      pcVar1 = strdup(local_30[0]);
      *err = pcVar1;
    }
    if (local_30[0] != local_20) {
      operator_delete(local_30[0]);
    }
    return 0;
  }
  sVar2 = tinyexr::SaveEXRNPartImageToMemory(exr_images,exr_headers,num_parts,memory_out,err);
  return sVar2;
}

Assistant:

size_t SaveEXRMultipartImageToMemory(const EXRImage* exr_images,
                                     const EXRHeader** exr_headers,
                                     unsigned int num_parts,
                                     unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2 ||
      memory_out == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                              err);
    return 0;
  }
  return tinyexr::SaveEXRNPartImageToMemory(exr_images, exr_headers, num_parts, memory_out, err);
}